

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OricMFMDSK.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::OricMFMDSK::get_track_at_position(OricMFMDSK *this,Address address)

{
  FileHolder *this_00;
  _func_int *p_Var1;
  bool bVar2;
  undefined8 uVar3;
  OricMFMDSK *pOVar4;
  ulong uVar5;
  uint8_t uVar6;
  pthread_mutex_t *this_01;
  long lVar7;
  Address in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  shared_ptr<Storage::Disk::Track> sVar12;
  uint8_t last_header [6];
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  encoder;
  PCMSegment segment;
  uint8_t local_b0 [3];
  byte bStack_ad;
  undefined2 local_ac;
  undefined1 local_a8 [24];
  OricMFMDSK *local_90;
  PCMSegment local_88;
  
  local_88.length_of_a_bit.length = 1;
  local_88.length_of_a_bit.clock_rate = 1;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_pointer)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_pointer)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  this_00 = (FileHolder *)((long)address + 8);
  local_90 = this;
  this_01 = (pthread_mutex_t *)FileHolder::get_file_access_mutex(this_00);
  std::mutex::lock((mutex *)&this_01->__data);
  local_a8._16_8_ = this_01;
  lVar7 = get_file_offset_for_position((OricMFMDSK *)address,in_RDX);
  FileHolder::seek(this_00,lVar7,0);
  local_ac = 0;
  _local_b0 = 0;
  Encodings::MFM::GetMFMEncoder
            ((MFM *)local_a8,&local_88.data,(vector<bool,_std::allocator<bool>_> *)0x0);
  bVar11 = false;
  uVar5 = 0;
LAB_003da526:
  do {
    do {
      while( true ) {
        while( true ) {
          uVar10 = uVar5;
          if (0x1869 < uVar10) {
            if ((Time)local_a8._0_8_ != (Time)0x0) {
              (**(code **)(*(_func_int **)local_a8._0_8_ + 8))();
            }
            pthread_mutex_unlock((pthread_mutex_t *)local_a8._16_8_);
            std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment&>
                      ((PCMSegment *)local_a8);
            pOVar4 = local_90;
            uVar3 = local_a8._8_8_;
            local_a8._8_8_ = (_Bit_type *)0x0;
            (local_90->super_DiskImage)._vptr_DiskImage = (_func_int **)local_a8._0_8_;
            (local_90->file_).file_ = (FILE *)uVar3;
            local_a8._0_4_ = 0;
            local_a8._4_4_ = 0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
            PCMSegment::~PCMSegment(&local_88);
            sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = extraout_RDX._M_pi;
            sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pOVar4;
            return (shared_ptr<Storage::Disk::Track>)
                   sVar12.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
          }
          uVar6 = FileHolder::get8(this_00);
          uVar9 = uVar10 + 1;
          p_Var1 = *(_func_int **)local_a8._0_8_;
          uVar5 = uVar9;
          if (uVar6 != 0xa1) break;
          bVar11 = true;
          (**(code **)(p_Var1 + 0x40))(local_a8._0_8_,0x4489,0);
        }
        if (uVar6 != 0xc2) break;
        (**(code **)(p_Var1 + 0x40))(local_a8._0_8_,0x5224,0);
      }
      (**(code **)(p_Var1 + 0x18))(local_a8._0_8_,uVar6,0);
      bVar2 = !bVar11;
      bVar11 = false;
    } while (bVar2);
    if (uVar6 == 0xfb) {
      uVar8 = 0x80 << (bStack_ad & 0x1f) | 2;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      do {
        uVar3 = local_a8._0_8_;
        if (uVar8 == 0) {
          bVar11 = false;
          uVar5 = uVar9;
          break;
        }
        uVar6 = FileHolder::get8(this_00);
        (**(code **)(*(_func_int **)uVar3 + 0x18))(uVar3,uVar6,0);
        uVar9 = uVar9 + 1;
        bVar11 = false;
        uVar5 = 0x1900;
        uVar8 = uVar8 - 1;
      } while (uVar9 != 0x1900);
      goto LAB_003da526;
    }
    bVar11 = false;
    if (uVar6 == 0xfe) {
      lVar7 = 0;
      do {
        if (lVar7 == 6) {
          bVar11 = false;
          uVar5 = uVar10 + 7;
          break;
        }
        uVar6 = FileHolder::get8(this_00);
        local_b0[lVar7] = uVar6;
        (**(code **)(*(_func_int **)local_a8._0_8_ + 0x18))(local_a8._0_8_,uVar6,0);
        lVar7 = lVar7 + 1;
        bVar11 = false;
        uVar5 = 0x186a;
      } while (0x1869 - uVar10 != lVar7);
    }
  } while( true );
}

Assistant:

std::shared_ptr<Track> OricMFMDSK::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(get_file_offset_for_position(address), SEEK_SET);

		// The file format omits clock bits. So it's not a genuine MFM capture.
		// A consumer must contextually guess when an FB, FC, etc is meant to be a control mark.
		std::size_t track_offset = 0;
		uint8_t last_header[6] = {0, 0, 0, 0, 0, 0};
		std::unique_ptr<Encodings::MFM::Encoder> encoder = Encodings::MFM::GetMFMEncoder(segment.data);
		bool did_sync = false;
		while(track_offset < 6250) {
			uint8_t next_byte = file_.get8();
			track_offset++;

			switch(next_byte) {
				default: {
					encoder->add_byte(next_byte);
					if(did_sync) {
						switch(next_byte) {
							default: break;

							case 0xfe:
								for(int byte = 0; byte < 6; byte++) {
									last_header[byte] = file_.get8();
									encoder->add_byte(last_header[byte]);
									++track_offset;
									if(track_offset == 6250) break;
								}
							break;

							case 0xfb:
								for(int byte = 0; byte < (128 << last_header[3]) + 2; byte++) {
									encoder->add_byte(file_.get8());
									++track_offset;
									// Special exception: don't interrupt a sector body if it seems to
									// be about to run over the end of the track. It seems like BD-500
									// disks break the usual 6250-byte rule, pushing out to just less
									// than 6400 bytes total.
									if(track_offset == 6400) break;
								}
							break;
						}
					}

					did_sync = false;
				}
				break;

				case 0xa1:	// a synchronisation mark that implies a sector or header coming
					encoder->output_short(Storage::Encodings::MFM::MFMSync);
					did_sync = true;
				break;

				case 0xc2:	// an 'ordinary' synchronisation mark
					encoder->output_short(Storage::Encodings::MFM::MFMIndexSync);
				break;
			}
		}
	}

	return std::make_shared<PCMTrack>(segment);
}